

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis_enc.c
# Opt level: O1

int VP8EncAnalyze(VP8Encoder *enc)

{
  size_t __n;
  VP8MBInfo *pVVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  WebPWorkerInterface *pWVar8;
  long lVar9;
  void *ptr;
  int iVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  VP8Encoder *pVVar14;
  int *piVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  int iVar26;
  int w;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int centers [4];
  int dist_accum [4];
  int accum [4];
  SegmentJob side_job;
  ulong local_2740;
  ulong local_2738;
  uint local_272c [5];
  undefined1 local_2718 [16];
  ulong local_2708;
  VP8Encoder *local_2700;
  size_t local_26f8;
  ulong local_26f0;
  int local_26e8 [4];
  int local_26d8 [6];
  SegmentJob local_26c0;
  SegmentJob local_1378;
  
  if (((enc->config_->emulate_jpeg_size == 0) && ((enc->segment_hdr_).num_segments_ < 2)) &&
     (1 < enc->method_)) {
    if (0 < enc->mb_h_ * enc->mb_w_) {
      lVar9 = 0;
      do {
        pVVar1 = enc->mb_info_;
        *(byte *)(pVVar1 + lVar9) = (*(byte *)(pVVar1 + lVar9) & 0x80) + 1;
        pVVar1[lVar9].alpha_ = '\0';
        lVar9 = lVar9 + 1;
      } while (lVar9 < (long)enc->mb_h_ * (long)enc->mb_w_);
    }
    enc->dqm_[0].alpha_ = 0;
    enc->dqm_[0].beta_ = 0;
    enc->alpha_ = 0;
    enc->uv_alpha_ = 0;
    WebPReportProgress(enc->pic_,enc->percent_ + 0x14,&enc->percent_);
    local_272c[0] = 1;
  }
  else {
    iVar24 = enc->mb_h_;
    iVar13 = enc->mb_w_ * iVar24;
    iVar26 = enc->thread_level_;
    pWVar8 = WebPGetWorkerInterface();
    if ((iVar26 < 1) || (iVar26 = iVar24 * 9 + 0xf >> 4, iVar26 < 2)) {
      InitSegmentJob(enc,&local_26c0,0,iVar24);
      (*pWVar8->Execute)(&local_26c0.worker);
      local_272c[0] = (*pWVar8->Sync)(&local_26c0.worker);
      local_272c[0] = local_272c[0] & 1;
    }
    else {
      InitSegmentJob(enc,&local_26c0,0,iVar26);
      local_272c[0] = 0;
      InitSegmentJob(enc,&local_1378,iVar26,iVar24);
      uVar4 = (*pWVar8->Reset)(&local_1378.worker);
      if ((uVar4 & 1) != 0) {
        (*pWVar8->Launch)(&local_1378.worker);
        (*pWVar8->Execute)(&local_26c0.worker);
        uVar4 = (*pWVar8->Sync)(&local_1378.worker);
        uVar5 = (*pWVar8->Sync)(&local_26c0.worker);
        local_272c[0] = uVar5 & uVar4 & 1;
      }
      (*pWVar8->End)(&local_1378.worker);
      if (local_272c[0] != 0) {
        lVar9 = 0;
        do {
          iVar24 = local_1378.alphas[lVar9 + 1];
          iVar26 = local_1378.alphas[lVar9 + 2];
          iVar16 = local_1378.alphas[lVar9 + 3];
          iVar22 = local_26c0.alphas[lVar9 + 1];
          iVar10 = local_26c0.alphas[lVar9 + 2];
          iVar6 = local_26c0.alphas[lVar9 + 3];
          local_26c0.alphas[lVar9] = local_26c0.alphas[lVar9] + local_1378.alphas[lVar9];
          local_26c0.alphas[lVar9 + 1] = iVar22 + iVar24;
          local_26c0.alphas[lVar9 + 2] = iVar10 + iVar26;
          local_26c0.alphas[lVar9 + 3] = iVar6 + iVar16;
          lVar9 = lVar9 + 4;
        } while (lVar9 != 0x100);
        iVar24 = local_26c0.uv_alpha;
        local_26c0.alpha = local_26c0.alpha + local_1378.alpha;
        local_26c0.uv_alpha = iVar24 + local_1378.uv_alpha;
      }
    }
    (*pWVar8->End)(&local_26c0.worker);
    if (local_272c[0] != 0) {
      enc->alpha_ = local_26c0.alpha / iVar13;
      enc->uv_alpha_ = local_26c0.uv_alpha / iVar13;
      uVar4 = (enc->segment_hdr_).num_segments_;
      uVar5 = 4;
      if ((int)uVar4 < 4) {
        uVar5 = uVar4;
      }
      uVar25 = 0;
      do {
        if (local_26c0.alphas[uVar25] != 0) goto LAB_00134569;
        uVar25 = uVar25 + 1;
      } while (uVar25 != 0x100);
      uVar25 = 0x100;
LAB_00134569:
      local_2740 = 0xff;
      iVar24 = (int)uVar25;
      local_2708 = uVar25 & 0xffffffff;
      if (iVar24 < 0xff) {
        local_2740 = 0xff;
        do {
          if (local_26c0.alphas[local_2740] != 0) goto LAB_001345b9;
          local_2740 = local_2740 - 1;
        } while ((uVar25 & 0xffffffff) < local_2740);
        local_2740 = uVar25 & 0xffffffff;
      }
LAB_001345b9:
      local_2700 = enc;
      iVar26 = (int)local_2740;
      if (0 < (int)uVar4) {
        iVar13 = iVar26 - iVar24;
        lVar9 = (ulong)uVar5 - 1;
        auVar27._8_4_ = (int)lVar9;
        auVar27._0_8_ = lVar9;
        auVar27._12_4_ = (int)((ulong)lVar9 >> 0x20);
        iVar16 = iVar26 * 3 + iVar24 * -3;
        iVar22 = iVar26 * 4 + iVar24 * -4;
        uVar23 = 0;
        auVar27 = auVar27 ^ _DAT_00155fb0;
        auVar28 = _DAT_00154d70;
        do {
          auVar29 = auVar28 ^ _DAT_00155fb0;
          if ((bool)(~(auVar29._4_4_ == auVar27._4_4_ && auVar27._0_4_ < auVar29._0_4_ ||
                      auVar27._4_4_ < auVar29._4_4_) & 1)) {
            *(int *)((long)local_272c + uVar23 + 4) = iVar13 / (int)(uVar5 * 2) + iVar24;
          }
          if ((auVar29._12_4_ != auVar27._12_4_ || auVar29._8_4_ <= auVar27._8_4_) &&
              auVar29._12_4_ <= auVar27._12_4_) {
            *(int *)((long)local_272c + uVar23 + 8) = iVar16 / (int)(uVar5 * 2) + iVar24;
          }
          lVar9 = auVar28._8_8_;
          auVar28._0_8_ = auVar28._0_8_ + 2;
          auVar28._8_8_ = lVar9 + 2;
          uVar23 = uVar23 + 8;
          iVar16 = iVar16 + iVar22;
          iVar13 = iVar13 + iVar22;
        } while ((uVar5 * 4 + 4 & 0x38) != uVar23);
      }
      __n = (ulong)(uVar5 - 1) * 4 + 4;
      local_26f8 = __n;
      if (iVar24 < iVar26) {
        iVar24 = iVar26;
      }
      iVar13 = 0;
      local_26f0 = uVar25;
      do {
        if (0 < (int)uVar4) {
          memset(local_26d8,0,__n);
          memset(local_26e8,0,__n);
          uVar25 = local_26f0;
        }
        if ((int)uVar25 <= iVar26) {
          iVar16 = 0;
          uVar23 = local_2708;
          do {
            iVar22 = local_26c0.alphas[uVar23];
            if (iVar22 != 0) {
              uVar7 = iVar16 + 1U;
              if ((int)(iVar16 + 1U) < (int)uVar5) {
                uVar7 = uVar5;
              }
              iVar10 = iVar16 + -1;
              lVar9 = (long)iVar16;
              do {
                lVar17 = lVar9 + 1;
                iVar6 = (int)uVar23;
                iVar16 = uVar7 - 1;
                if ((int)uVar5 <= lVar17) break;
                uVar19 = iVar6 - local_272c[lVar9 + 2];
                uVar3 = -uVar19;
                if (0 < (int)uVar19) {
                  uVar3 = uVar19;
                }
                uVar20 = iVar6 - local_272c[lVar17];
                uVar19 = -uVar20;
                if (0 < (int)uVar20) {
                  uVar19 = uVar20;
                }
                iVar10 = iVar10 + 1;
                lVar9 = lVar17;
                iVar16 = iVar10;
              } while (uVar3 < uVar19);
              local_26e8[iVar16] = local_26e8[iVar16] + iVar22 * iVar6;
              local_1378.alphas[uVar23 - 0xc] = iVar16;
              local_26d8[iVar16] = local_26d8[iVar16] + iVar22;
            }
            uVar23 = uVar23 + 1;
          } while (uVar23 != iVar24 + 1);
        }
        if ((int)uVar4 < 1) {
          bVar2 = true;
          uVar23 = 0;
          iVar16 = 0;
        }
        else {
          uVar18 = 0;
          iVar16 = 0;
          iVar22 = 0;
          uVar23 = 0;
          do {
            iVar10 = local_26d8[uVar18];
            if (iVar10 != 0) {
              uVar7 = (iVar10 / 2 + local_26e8[uVar18]) / iVar10;
              iVar12 = local_272c[uVar18 + 1] - uVar7;
              iVar6 = -iVar12;
              if (0 < iVar12) {
                iVar6 = iVar12;
              }
              iVar22 = iVar22 + iVar6;
              local_272c[uVar18 + 1] = uVar7;
              iVar16 = iVar16 + uVar7 * iVar10;
              uVar23 = (ulong)(uint)((int)uVar23 + iVar10);
            }
            uVar18 = uVar18 + 1;
          } while (uVar5 != uVar18);
          bVar2 = iVar22 < 5;
        }
        pVVar14 = local_2700;
      } while ((!bVar2) && (iVar13 = iVar13 + 1, iVar13 != 6));
      iVar26 = (iVar16 + ((int)(uVar23 >> 0x1f) + (int)uVar23 >> 1)) / (int)uVar23;
      uVar5 = local_2700->mb_w_;
      iVar24 = local_2700->mb_h_;
      iVar13 = iVar24 * uVar5;
      if (0 < iVar13) {
        lVar9 = 0;
        do {
          pVVar1 = local_2700->mb_info_;
          iVar24 = local_1378.alphas[(ulong)pVVar1[lVar9].alpha_ - 0xc];
          *(byte *)(pVVar1 + lVar9) = *(byte *)(pVVar1 + lVar9) & 0x9f | ((byte)iVar24 & 3) << 5;
          pVVar1[lVar9].alpha_ = (uint8_t)local_272c[(long)iVar24 + 1];
          lVar9 = lVar9 + 1;
          uVar5 = local_2700->mb_w_;
          iVar24 = local_2700->mb_h_;
          iVar13 = iVar24 * uVar5;
        } while (lVar9 < iVar13);
      }
      if (((1 < (int)uVar4) && ((local_2700->config_->preprocessing & 1) != 0)) &&
         (ptr = WebPSafeMalloc((long)iVar13,1), ptr != (void *)0x0)) {
        if (2 < iVar24) {
          local_2708 = CONCAT44(local_2708._4_4_,iVar26);
          uVar4 = uVar5 - 1;
          uVar25 = (ulong)uVar5;
          local_2738 = 1;
          do {
            if (2 < (int)uVar5) {
              uVar23 = 1;
              do {
                local_2718 = (undefined1  [16])0x0;
                lVar9 = local_2738 * uVar25 + uVar23;
                pVVar1 = local_2700->mb_info_ + lVar9;
                bVar11 = *(byte *)pVVar1;
                *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)~uVar5) >> 3 & 0xc)) =
                     *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)~uVar5) >> 3 & 0xc)) + 1;
                *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)-uVar5) >> 3 & 0xc)) =
                     *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)-uVar5) >> 3 & 0xc)) + 1;
                *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)(1 - uVar5)) >> 3 & 0xc)) =
                     *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)(1 - uVar5)) >> 3 & 0xc)) + 1;
                *(int *)(local_2718 + (*(byte *)(pVVar1 + -1) >> 3 & 0xc)) =
                     *(int *)(local_2718 + (*(byte *)(pVVar1 + -1) >> 3 & 0xc)) + 1;
                *(int *)(local_2718 + (*(byte *)(pVVar1 + 1) >> 3 & 0xc)) =
                     *(int *)(local_2718 + (*(byte *)(pVVar1 + 1) >> 3 & 0xc)) + 1;
                *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)uVar4) >> 3 & 0xc)) =
                     *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)uVar4) >> 3 & 0xc)) + 1;
                *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)uVar5) >> 3 & 0xc)) =
                     *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)uVar5) >> 3 & 0xc)) + 1;
                bVar11 = bVar11 >> 5 & 3;
                *(int *)(local_2718 + (*(byte *)(pVVar1 + (long)(int)uVar5 + 1) >> 3 & 0xc)) =
                     *(int *)(local_2718 + (*(byte *)(pVVar1 + (long)(int)uVar5 + 1) >> 3 & 0xc)) +
                     1;
                lVar17 = 0;
                do {
                  if (4 < *(int *)(local_2718 + lVar17 * 4)) {
                    bVar11 = (byte)lVar17;
                    break;
                  }
                  lVar17 = lVar17 + 1;
                } while (lVar17 != 4);
                *(byte *)((long)ptr + lVar9) = bVar11;
                uVar23 = uVar23 + 1;
              } while (uVar23 != uVar4);
            }
            local_2738 = local_2738 + 1;
          } while (local_2738 != iVar24 - 1);
          lVar9 = uVar25 + 1;
          uVar23 = 1;
          do {
            lVar17 = lVar9;
            lVar21 = (ulong)uVar4 - 1;
            if (2 < (int)uVar5) {
              do {
                *(byte *)(local_2700->mb_info_ + lVar17) =
                     *(byte *)(local_2700->mb_info_ + lVar17) & 0x9f |
                     (*(byte *)((long)ptr + lVar17) & 3) << 5;
                lVar21 = lVar21 + -1;
                lVar17 = lVar17 + 1;
              } while (lVar21 != 0);
            }
            uVar23 = uVar23 + 1;
            lVar9 = lVar9 + uVar25;
            pVVar14 = local_2700;
            iVar26 = (int)local_2708;
          } while (uVar23 != iVar24 - 1);
        }
        WebPSafeFree(ptr);
      }
      iVar24 = (pVVar14->segment_hdr_).num_segments_;
      lVar9 = (long)iVar24;
      uVar4 = local_272c[1];
      if (1 < lVar9) {
        lVar17 = 0;
        do {
          uVar5 = local_272c[lVar17 + 1];
          if ((int)uVar5 <= (int)local_272c[1]) {
            local_272c[1] = uVar5;
          }
          if ((int)uVar4 <= (int)uVar5) {
            uVar4 = uVar5;
          }
          lVar17 = lVar17 + 1;
        } while (lVar9 != lVar17);
      }
      if (0 < iVar24) {
        uVar5 = local_272c[1] + 1;
        if (uVar4 != local_272c[1]) {
          uVar5 = uVar4;
        }
        piVar15 = &pVVar14->dqm_[0].beta_;
        lVar17 = 0;
        do {
          iVar24 = (int)((local_272c[lVar17 + 1] - iVar26) * 0xff) / (int)(uVar5 - local_272c[1]);
          iVar13 = (int)((local_272c[lVar17 + 1] - local_272c[1]) * 0xff) /
                   (int)(uVar5 - local_272c[1]);
          if (0x7e < iVar24) {
            iVar24 = 0x7f;
          }
          if (iVar24 < -0x7e) {
            iVar24 = -0x7f;
          }
          piVar15[-1] = iVar24;
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          if (iVar13 < 1) {
            iVar13 = 0;
          }
          *piVar15 = iVar13;
          lVar17 = lVar17 + 1;
          piVar15 = piVar15 + 0xba;
        } while (lVar9 != lVar17);
      }
    }
  }
  return local_272c[0];
}

Assistant:

int VP8EncAnalyze(VP8Encoder* const enc) {
  int ok = 1;
  const int do_segments =
      enc->config_->emulate_jpeg_size ||   // We need the complexity evaluation.
      (enc->segment_hdr_.num_segments_ > 1) ||
      (enc->method_ <= 1);  // for method 0 - 1, we need preds_[] to be filled.
  if (do_segments) {
    const int last_row = enc->mb_h_;
    // We give a little more than a half work to the main thread.
    const int split_row = (9 * last_row + 15) >> 4;
    const int total_mb = last_row * enc->mb_w_;
#ifdef WEBP_USE_THREAD
    const int kMinSplitRow = 2;  // minimal rows needed for mt to be worth it
    const int do_mt = (enc->thread_level_ > 0) && (split_row >= kMinSplitRow);
#else
    const int do_mt = 0;
#endif
    const WebPWorkerInterface* const worker_interface =
        WebPGetWorkerInterface();
    SegmentJob main_job;
    if (do_mt) {
      SegmentJob side_job;
      // Note the use of '&' instead of '&&' because we must call the functions
      // no matter what.
      InitSegmentJob(enc, &main_job, 0, split_row);
      InitSegmentJob(enc, &side_job, split_row, last_row);
      // we don't need to call Reset() on main_job.worker, since we're calling
      // WebPWorkerExecute() on it
      ok &= worker_interface->Reset(&side_job.worker);
      // launch the two jobs in parallel
      if (ok) {
        worker_interface->Launch(&side_job.worker);
        worker_interface->Execute(&main_job.worker);
        ok &= worker_interface->Sync(&side_job.worker);
        ok &= worker_interface->Sync(&main_job.worker);
      }
      worker_interface->End(&side_job.worker);
      if (ok) MergeJobs(&side_job, &main_job);  // merge results together
    } else {
      // Even for single-thread case, we use the generic Worker tools.
      InitSegmentJob(enc, &main_job, 0, last_row);
      worker_interface->Execute(&main_job.worker);
      ok &= worker_interface->Sync(&main_job.worker);
    }
    worker_interface->End(&main_job.worker);
    if (ok) {
      enc->alpha_ = main_job.alpha / total_mb;
      enc->uv_alpha_ = main_job.uv_alpha / total_mb;
      AssignSegments(enc, main_job.alphas);
    }
  } else {   // Use only one default segment.
    ResetAllMBInfo(enc);
  }
  return ok;
}